

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::SaveFile(XMLDocument *this,FILE *fp,bool compact)

{
  XMLError XVar1;
  undefined1 local_158 [8];
  XMLPrinter stream;
  bool compact_local;
  FILE *fp_local;
  XMLDocument *this_local;
  
  stream._buffer._39_1_ = compact;
  ClearError(this);
  XMLPrinter::XMLPrinter((XMLPrinter *)local_158,fp,(bool)(stream._buffer._39_1_ & 1),0);
  Print(this,(XMLPrinter *)local_158);
  XVar1 = this->_errorID;
  XMLPrinter::~XMLPrinter((XMLPrinter *)local_158);
  return XVar1;
}

Assistant:

XMLError XMLDocument::SaveFile(FILE* fp, bool compact)
{
    // Clear any error from the last save, otherwise it will get reported
    // for *this* call.
    ClearError();
    XMLPrinter stream(fp, compact);
    Print(&stream);
    return _errorID;
}